

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O1

void __thiscall LINAnalyzerSettings::LINAnalyzerSettings(LINAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceNumberList *pAVar3;
  AnalyzerSettingInterfaceInteger *pAVar4;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceNumberList *this_02;
  AnalyzerSettingInterfaceInteger *this_03;
  ulong uVar5;
  Channel *pCVar6;
  char *pcVar7;
  uint uVar8;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__LINAnalyzerSettings_0010cd60;
  this_00 = &this->mInputChannel;
  uVar5 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mLINVersion = 2.0;
  this->mBitRate = 20000;
  paVar1 = &this->mInputChannelInterface;
  (this->mInputChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mLINVersionInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitRateInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar2 = paVar1->_M_ptr;
  if (pAVar2 != this_01) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    paVar1->_M_ptr = this_01;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)paVar1->_M_ptr,"Serial");
  pCVar6 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)paVar1->_M_ptr);
  this_02 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_02);
  pAVar3 = (this->mLINVersionInterface)._M_ptr;
  if (pAVar3 != this_02) {
    if (pAVar3 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar3 + 8))();
    }
    (this->mLINVersionInterface)._M_ptr = this_02;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mLINVersionInterface)._M_ptr,"LIN Version");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mLINVersionInterface)._M_ptr,"Version 1.x");
  pcVar7 = "Version 2.x";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mLINVersionInterface)._M_ptr,"Version 2.x");
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mLINVersion);
  this_03 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_03);
  pAVar4 = (this->mBitRateInterface)._M_ptr;
  if (pAVar4 != this_03) {
    if (pAVar4 != (AnalyzerSettingInterfaceInteger *)0x0) {
      (**(code **)(*(long *)pAVar4 + 8))();
    }
    (this->mBitRateInterface)._M_ptr = this_03;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mBitRateInterface)._M_ptr,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax((int)(this->mBitRateInterface)._M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)(this->mBitRateInterface)._M_ptr);
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar8 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar8,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

LINAnalyzerSettings::LINAnalyzerSettings() : mInputChannel( UNDEFINED_CHANNEL ), mLINVersion( 2.0 ), mBitRate( 20000 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Serial", "Standard LIN" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mLINVersionInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mLINVersionInterface->SetTitleAndTooltip( "LIN Version", "Specify the LIN protocol version 1 or 2." );
    mLINVersionInterface->AddNumber( 1.0, "Version 1.x", "LIN Protocol Specification Version 1.x" );
    mLINVersionInterface->AddNumber( 2.0, "Version 2.x", "LIN Protocol Specification Version 2.x" );
    mLINVersionInterface->SetNumber( mLINVersion );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 1000000 );
    mBitRateInterface->SetMin( 1000 );
    mBitRateInterface->SetInteger( mBitRate );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mLINVersionInterface.get() );
    AddInterface( mBitRateInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Serial", false );
}